

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int backupTruncateFile(sqlite3_file *pFile,i64 iSize)

{
  int iVar1;
  long in_FS_OFFSET;
  i64 iCurrent;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = (*pFile->pMethods->xFileSize)(pFile,(sqlite3_int64 *)&local_20);
  if ((iVar1 == 0) && (iVar1 = 0, iSize < (long)local_20)) {
    iVar1 = (*pFile->pMethods->xTruncate)(pFile,iSize);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int backupTruncateFile(sqlite3_file *pFile, i64 iSize){
  i64 iCurrent;
  int rc = sqlite3OsFileSize(pFile, &iCurrent);
  if( rc==SQLITE_OK && iCurrent>iSize ){
    rc = sqlite3OsTruncate(pFile, iSize);
  }
  return rc;
}